

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Variation.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Variation *variation)

{
  ostream *poVar1;
  long lVar2;
  char *pcVar3;
  char *local_40;
  long local_38;
  char local_30 [16];
  
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,*(long *)(variation + 8),
             *(long *)(variation + 0x10) + *(long *)(variation + 8));
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(os,local_40,local_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ",1);
  if (local_40 != local_30) {
    operator_delete(local_40);
  }
  if (*(int *)(variation + 0x60) == 1) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    std::__ostream_insert<char,std::char_traits<char>>(poVar1," INS",4);
    if (*(long *)(variation + 0x48) == 0) {
      return os;
    }
    std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
    pcVar3 = *(char **)(variation + 0x40);
    lVar2 = *(long *)(variation + 0x48);
    poVar1 = os;
  }
  else if (*(int *)(variation + 0x60) == 2) {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    pcVar3 = " DEL";
    lVar2 = 4;
  }
  else {
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)os);
    pcVar3 = " NONE";
    lVar2 = 5;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,pcVar3,lVar2);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const Variation& variation) {
	os << variation.getChromosome() << " " << variation.getCoordinate1() << " ";
	switch (variation.getType()) {
	case Variation::INSERTION:
		os << variation.getCoordinate2() << " INS";
		if (variation.getSequence().size() > 0) {
			os << " " << variation.getSequence();
		}
		break;
	case Variation::DELETION:
		os << (variation.getCoordinate2()-1) << " DEL";
		break;
	default:
		os << variation.getCoordinate2() << " NONE";
		break;
	}
	return os;
}